

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_2::UBOToSSBOInvertCase::UBOToSSBOInvertCase
          (UBOToSSBOInvertCase *this,Context *context,char *name,char *description,int numValues,
          IVec3 *localSize,IVec3 *workSize)

{
  int i;
  long lVar1;
  undefined4 in_register_00000084;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,name,"Copy from UBO to SSBO, inverting bits");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00b59430;
  this->m_numValues = (int)description;
  lVar1 = 0;
  do {
    (this->m_localSize).m_data[lVar1] =
         *(int *)(CONCAT44(in_register_00000084,numValues) + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    (this->m_workSize).m_data[lVar1] = localSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

UBOToSSBOInvertCase (Context& context, const char* name, const char* description, int numValues, const tcu::IVec3& localSize, const tcu::IVec3& workSize)
		: TestCase		(context, name, description)
		, m_numValues	(numValues)
		, m_localSize	(localSize)
		, m_workSize	(workSize)
	{
		DE_ASSERT(m_numValues % (m_workSize[0]*m_workSize[1]*m_workSize[2]*m_localSize[0]*m_localSize[1]*m_localSize[2]) == 0);
	}